

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O1

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          uint batchSize,InnerRegisterSupplier *registerSupplier)

{
  pointer poVar1;
  ushort uVar2;
  ushort uVar3;
  _Manager_type p_Var4;
  pointer pSVar5;
  pointer pSVar6;
  bool bVar7;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
  *pvVar8;
  int iVar9;
  uint uVar10;
  undefined8 uVar11;
  _Storage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true> _Var12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  size_type __n;
  long lVar17;
  long lVar18;
  long lVar19;
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
  writeBuffer;
  vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
  frontLine;
  KeyValue<supermap::Key<2UL>,_unsigned_int> minItem;
  vector<unsigned_int,_std::allocator<unsigned_int>_> currentFrontPointers;
  _Storage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true> local_108;
  _Storage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true> _Stack_100;
  long local_f8;
  ulong local_f0;
  uint local_e4;
  size_type local_e0;
  vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
  local_d8;
  ulong local_c0;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
  *local_b8;
  long local_b0;
  KeyValue<supermap::Key<2UL>,_unsigned_int> local_a8;
  path local_a0;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  shared_ptr<supermap::io::FileManager> local_58;
  long local_48;
  long local_40;
  long local_38;
  
  local_e4 = batchSize;
  std::filesystem::__cxx11::path::path(&local_a0,dataFileName,auto_format);
  local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_68 = (_Manager_type)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = registerSupplier->_M_invoker;
  p_Var4 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var4;
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
  ::SingleFileIndexedStorage
            (&this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
             ,&local_a0,&local_58,(InnerRegisterSupplier *)&local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path(&local_a0);
  (this->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
  ).super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>.
  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>.
  _vptr_OrderedStorage = (_func_int **)&PTR_append_002029f8;
  (this->super_Findable<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_supermap::Key<2UL>_>).
  _vptr_Findable = (_func_int **)&DAT_00202a40;
  pSVar5 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __n = ((long)pSVar6 - (long)pSVar5 >> 3) * 0x6db6db6db6db6db7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,__n,
             (allocator_type *)&local_d8);
  _Stack_100._M_value = _Stack_100._M_value & 0xffffffffffffff00;
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
  ::vector(&local_d8,__n,(value_type *)&local_108._M_value,(allocator_type *)&local_a8);
  local_e0 = __n;
  if (pSVar6 == pSVar5) {
    lVar13 = 0;
  }
  else {
    lVar17 = __n + (__n == 0);
    lVar15 = 8;
    lVar16 = 0;
    lVar13 = 0;
    do {
      pSVar5 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar9 = (**(code **)(*(long *)((long)&(pSVar5->
                                            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                            ).
                                            super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                            ._vptr_OrderedStorage + lVar16) + 8))
                        ((long)&(pSVar5->
                                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                ).
                                super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                .
                                super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                ._vptr_OrderedStorage + lVar16);
      poVar1 = local_d8.
               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (iVar9 != 0) {
        pSVar5 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (**(code **)(*(long *)((long)&(pSVar5->
                                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                               ).
                                               super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                               .
                                               super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                               ._vptr_OrderedStorage + lVar16) + 0x20))
                           ((long)&(pSVar5->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                   ._vptr_OrderedStorage + lVar16,0);
        if (*(char *)((long)&(poVar1->
                             super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                             ._M_payload + lVar15) == '\x01') {
          *(undefined1 *)
           ((long)&(poVar1->
                   super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                   )._M_payload.
                   super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                   ._M_payload + lVar15) = 0;
        }
        *(undefined8 *)((long)poVar1 + lVar15 + -8) = uVar11;
        *(undefined1 *)
         ((long)&(poVar1->
                 super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                 ._M_payload + lVar15) = 1;
        pSVar5 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (**(code **)(*(long *)((long)&(pSVar5->
                                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                               ).
                                               super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                               .
                                               super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                               ._vptr_OrderedStorage + lVar16) + 8))
                           ((long)&(pSVar5->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                   ._vptr_OrderedStorage + lVar16);
        lVar13 = lVar13 + (ulong)uVar10;
      }
      lVar16 = lVar16 + 0x38;
      lVar15 = lVar15 + 0xc;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  (*(this->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
    ).super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
    .super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>.
    register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_supermap::CountingStorageInfo<unsigned_int,_void>_>_>
    ._vptr_Cloneable[5])
            (&(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
              .register_,lVar13);
  local_108 = (_Storage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true>)0x0;
  _Stack_100 = (_Storage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true>)0x0;
  local_f8 = 0;
  local_c0 = (ulong)local_e4;
  std::
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
             *)&local_108._M_value,local_c0);
  local_e0 = (size_type)((int)local_e0 - 1);
  local_38 = local_e0 + 1;
  local_40 = local_e0 * 0xc;
  local_48 = local_e0 * 0x38;
  local_b8 = newer;
  do {
    if ((int)local_e0 < 0) {
      lVar13 = 0;
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      lVar15 = local_48;
      lVar16 = 0;
      lVar17 = local_40;
      lVar18 = local_38;
      do {
        pvVar8 = local_b8;
        lVar13 = lVar16;
        if ((&((local_d8.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
              )._M_payload.
              super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>.
              _M_engaged)[lVar17] == true) {
          lVar13 = lVar18 + -1;
          if ((uVar14 & 1) == 0) {
            uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
          }
          else {
            if (local_d8.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar16].
                super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>.
                _M_engaged == false) {
              std::__throw_bad_optional_access();
            }
            uVar2 = *(ushort *)
                     ((long)&((local_d8.
                               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                             ._M_payload + lVar17);
            uVar3 = *(ushort *)
                     &local_d8.
                      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar16].
                      super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                      ._M_payload;
            if ((-1 < (int)((uint)(ushort)(uVar2 << 8 | uVar2 >> 8) -
                           (uint)(ushort)(uVar3 << 8 | uVar3 >> 8))) &&
               (lVar13 = lVar16,
               *(_Type *)((long)&((local_d8.
                                   super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                                 )._M_payload.
                                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                                 ._M_payload + lVar17) ==
               *&local_d8.
                 super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar16].
                 super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                 ._M_payload._M_value.key.super_array<unsigned_char,_2UL>._M_elems)) {
              iVar9 = *(int *)(local_a0._M_pathname._M_dataplus._M_p + lVar18 * 4 + -4);
              *(uint *)(local_a0._M_pathname._M_dataplus._M_p + lVar18 * 4 + -4) = iVar9 + 1U;
              pSVar5 = (local_b8->
                       super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_f0 = uVar14;
              local_b0 = lVar16;
              uVar10 = (**(code **)(*(long *)((long)&(pSVar5->
                                                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                                  ).
                                                  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                                  .
                                                  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                                  ._vptr_OrderedStorage + lVar15) + 8))
                                 ((long)&(pSVar5->
                                         super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                         ).
                                         super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                         .
                                         super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                         ._vptr_OrderedStorage + lVar15);
              poVar1 = local_d8.
                       super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (iVar9 + 1U < uVar10) {
                pSVar5 = (pvVar8->
                         super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                uVar11 = (**(code **)(*(long *)((long)&(pSVar5->
                                                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                                  ).
                                                  super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                                  .
                                                  super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                                  ._vptr_OrderedStorage + lVar15) + 0x20))
                                   ((long)&(pSVar5->
                                           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                           ).
                                           super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                           .
                                           super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                           ._vptr_OrderedStorage + lVar15,
                                    *(undefined4 *)
                                     (local_a0._M_pathname._M_dataplus._M_p + lVar18 * 4 + -4));
                if ((&(poVar1->
                      super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                      )._M_payload.
                      super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                      ._M_engaged)[lVar17] == true) {
                  (&(poVar1->
                    super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                    )._M_payload.
                    super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                    ._M_engaged)[lVar17] = false;
                }
                *(undefined8 *)
                 ((long)&(poVar1->
                         super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                         )._M_payload.
                         super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                         ._M_payload + lVar17) = uVar11;
                (&(poVar1->
                  super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                  )._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                  ._M_engaged)[lVar17] = true;
                uVar14 = local_f0;
                lVar13 = local_b0;
              }
              else {
                uVar14 = local_f0;
                lVar13 = local_b0;
                if ((&((local_d8.
                        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                      )._M_payload.
                      super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                      ._M_engaged)[lVar17] == true) {
                  (&((local_d8.
                      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>
                    )._M_payload.
                    super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
                    ._M_engaged)[lVar17] = false;
                }
              }
            }
          }
        }
        lVar17 = lVar17 + -0xc;
        lVar15 = lVar15 + -0x38;
        lVar19 = lVar18 + -1;
        bVar7 = 0 < lVar18;
        newer = local_b8;
        lVar16 = lVar13;
        lVar18 = lVar19;
      } while (lVar19 != 0 && bVar7);
    }
    if ((uVar14 & 1) == 0) break;
    local_f0 = uVar14;
    if (local_d8.
        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar13].
        super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>.
        _M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    local_a8 = *(KeyValue<supermap::Key<2UL>,_unsigned_int> *)
                (local_d8.
                 super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar13);
    lVar13 = (long)(int)lVar13;
    iVar9 = *(int *)(local_a0._M_pathname._M_dataplus._M_p + lVar13 * 4);
    *(uint *)(local_a0._M_pathname._M_dataplus._M_p + lVar13 * 4) = iVar9 + 1U;
    pSVar5 = (newer->
             super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (**(code **)(*(long *)&pSVar5[lVar13].
                                    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                    .
                                    super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                    .
                                    super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                         + 8))(pSVar5 + lVar13);
    poVar1 = local_d8.
             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (iVar9 + 1U < uVar10) {
      pSVar5 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void,_supermap::Key<2UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      _Var12 = (_Storage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true>)
               (**(code **)(*(long *)&pSVar5[lVar13].
                                      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                      .
                                      super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                                      .
                                      super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
                           + 0x20))
                         (pSVar5 + lVar13,
                          *(undefined4 *)(local_a0._M_pathname._M_dataplus._M_p + lVar13 * 4));
      poVar1 = poVar1 + lVar13;
      if ((poVar1->
          super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>).
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>.
          _M_engaged == true) {
        (poVar1->
        super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>.
        _M_engaged = false;
      }
      (poVar1->
      super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>).
      _M_payload.super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
      ._M_payload = _Var12;
      (poVar1->
      super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>).
      _M_payload.super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
      ._M_engaged = true;
    }
    else if (local_d8.
             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar13].
             super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>.
             _M_payload.
             super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>.
             _M_engaged == true) {
      local_d8.
      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar13].
      super__Optional_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true,_true>.
      _M_payload.super__Optional_payload_base<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>
      ._M_engaged = false;
    }
    std::
    vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>>
    ::emplace_back<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>
              ((vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>>
                *)&local_108._M_value,&local_a8);
    if (local_e4 <= (uint)((ulong)((long)_Stack_100 - (long)local_108) >> 3)) {
      SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,unsigned_int,void>
      ::
      appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,unsigned_int,void>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,void>
                ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,unsigned_int,void>
                  *)this);
      if (_Stack_100 != local_108) {
        _Stack_100 = local_108;
      }
      std::
      vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
      ::reserve((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
                 *)&local_108._M_value,local_c0);
    }
  } while ((local_f0 & 1) != 0);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,unsigned_int,void>::
  appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,unsigned_int,void>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>*,std::vector<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,std::allocator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,void>
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,unsigned_int,void>
              *)this,local_108,_Stack_100);
  if (_Stack_100 != local_108) {
    _Stack_100 = local_108;
  }
  std::
  vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>
             *)&local_108._M_value,local_c0);
  if (local_108 != (_Storage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_true>)0x0) {
    operator_delete((void *)local_108,local_f8 - (long)local_108);
  }
  if (local_d8.
      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0._M_pathname._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_a0._M_pathname._M_dataplus._M_p,
                    local_a0._M_pathname.field_2._M_allocated_capacity -
                    (long)local_a0._M_pathname._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }